

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_tess_level.cpp
# Opt level: O2

ir_visitor_status __thiscall
anon_unknown.dwarf_76d91::lower_tess_level_visitor::visit
          (lower_tess_level_visitor *this,ir_variable *ir)

{
  glsl_type *pgVar1;
  long lVar2;
  exec_node *peVar3;
  uint __line;
  int iVar4;
  int iVar5;
  void *pvVar6;
  undefined4 extraout_var;
  exec_node *peVar7;
  glsl_type **ppgVar8;
  char *pcVar9;
  long lStack_40;
  
  pcVar9 = ir->name;
  if (pcVar9 == (char *)0x0) {
    return visit_continue;
  }
  iVar4 = strcmp(pcVar9,"gl_TessLevelInner");
  if ((iVar4 != 0) && (iVar5 = strcmp(pcVar9,"gl_TessLevelOuter"), iVar5 != 0)) {
    return visit_continue;
  }
  pgVar1 = ir->type;
  if (pgVar1->field_0x4 == '\x11') {
    iVar5 = strcmp(pcVar9,"gl_TessLevelOuter");
    if (iVar5 == 0) {
      if (this->old_tess_level_outer_var != (ir_variable *)0x0) {
        return visit_continue;
      }
      this->old_tess_level_outer_var = ir;
      if ((pgVar1->fields).array != &glsl_type::_float_type) {
        pcVar9 = "ir->type->fields.array == glsl_type::float_type";
        __line = 0x75;
        goto LAB_001776dd;
      }
      ppgVar8 = &glsl_type::vec4_type;
      pcVar9 = "gl_TessLevelOuterMESA";
      lStack_40 = 0x48;
    }
    else {
      if (iVar4 != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_tess_level.cpp"
                      ,0x93,
                      "virtual ir_visitor_status (anonymous namespace)::lower_tess_level_visitor::visit(ir_variable *)"
                     );
      }
      if (this->old_tess_level_inner_var != (ir_variable *)0x0) {
        return visit_continue;
      }
      this->old_tess_level_inner_var = ir;
      if ((pgVar1->fields).array != &glsl_type::_float_type) {
        __assert_fail("ir->type->fields.array == glsl_type::float_type",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_tess_level.cpp"
                      ,0x86,
                      "virtual ir_visitor_status (anonymous namespace)::lower_tess_level_visitor::visit(ir_variable *)"
                     );
      }
      ppgVar8 = &glsl_type::vec2_type;
      pcVar9 = "gl_TessLevelInnerMESA";
      lStack_40 = 0x50;
    }
    pvVar6 = ralloc_parent(ir);
    iVar4 = (*(ir->super_ir_instruction)._vptr_ir_instruction[4])(ir,pvVar6,0);
    *(void **)((long)&(this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.
                      super_ir_hierarchical_visitor._vptr_ir_hierarchical_visitor + lStack_40) =
         (void *)CONCAT44(extraout_var,iVar4);
    pcVar9 = ralloc_strdup((void *)CONCAT44(extraout_var,iVar4),pcVar9);
    lVar2 = *(long *)((long)&(this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.
                             super_ir_hierarchical_visitor._vptr_ir_hierarchical_visitor + lStack_40
                     );
    *(char **)(lVar2 + 0x28) = pcVar9;
    *(glsl_type **)(lVar2 + 0x20) = *ppgVar8;
    *(undefined4 *)(lVar2 + 0x60) = 0;
    peVar7 = (exec_node *)(lVar2 + 8);
    if (lVar2 == 0) {
      peVar7 = (exec_node *)0x0;
    }
    peVar3 = (ir->super_ir_instruction).super_exec_node.prev;
    peVar7->prev = peVar3;
    peVar7->next = (ir->super_ir_instruction).super_exec_node.next;
    peVar3->next = peVar7;
    ((ir->super_ir_instruction).super_exec_node.next)->prev = peVar7;
    (this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.
    field_0x31 = 1;
    return visit_continue;
  }
  pcVar9 = "ir->type->is_array()";
  __line = 0x6e;
LAB_001776dd:
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_tess_level.cpp"
                ,__line,
                "virtual ir_visitor_status (anonymous namespace)::lower_tess_level_visitor::visit(ir_variable *)"
               );
}

Assistant:

ir_visitor_status
lower_tess_level_visitor::visit(ir_variable *ir)
{
   if ((!ir->name) ||
       ((strcmp(ir->name, "gl_TessLevelInner") != 0) &&
        (strcmp(ir->name, "gl_TessLevelOuter") != 0)))
      return visit_continue;

   assert (ir->type->is_array());

   if (strcmp(ir->name, "gl_TessLevelOuter") == 0) {
      if (this->old_tess_level_outer_var)
         return visit_continue;

      old_tess_level_outer_var = ir;
      assert(ir->type->fields.array == glsl_type::float_type);

      /* Clone the old var so that we inherit all of its properties */
      new_tess_level_outer_var = ir->clone(ralloc_parent(ir), NULL);

      /* And change the properties that we need to change */
      new_tess_level_outer_var->name = ralloc_strdup(new_tess_level_outer_var,
                                                "gl_TessLevelOuterMESA");
      new_tess_level_outer_var->type = glsl_type::vec4_type;
      new_tess_level_outer_var->data.max_array_access = 0;

      ir->replace_with(new_tess_level_outer_var);
   } else if (strcmp(ir->name, "gl_TessLevelInner") == 0) {
      if (this->old_tess_level_inner_var)
         return visit_continue;

      old_tess_level_inner_var = ir;
      assert(ir->type->fields.array == glsl_type::float_type);

      /* Clone the old var so that we inherit all of its properties */
      new_tess_level_inner_var = ir->clone(ralloc_parent(ir), NULL);

      /* And change the properties that we need to change */
      new_tess_level_inner_var->name = ralloc_strdup(new_tess_level_inner_var,
                                                "gl_TessLevelInnerMESA");
      new_tess_level_inner_var->type = glsl_type::vec2_type;
      new_tess_level_inner_var->data.max_array_access = 0;

      ir->replace_with(new_tess_level_inner_var);
   } else {
      assert(0);
   }

   this->progress = true;

   return visit_continue;
}